

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkdetheme.cpp
# Opt level: O1

ColorScheme __thiscall QKdeThemePrivate::colorSchemeFromPalette(QKdeThemePrivate *this)

{
  QPalette *this_00;
  int iVar1;
  int iVar2;
  ColorScheme CVar3;
  QBrush *pQVar4;
  
  this_00 = (this->systemPalette)._M_t.
            super___uniq_ptr_impl<QPalette,_std::default_delete<QPalette>_>._M_t.
            super__Tuple_impl<0UL,_QPalette_*,_std::default_delete<QPalette>_>.
            super__Head_base<0UL,_QPalette_*,_false>._M_head_impl;
  if (this_00 == (QPalette *)0x0) {
    CVar3 = Unknown;
  }
  else {
    pQVar4 = QPalette::brush(this_00,Current,Text);
    iVar1 = QColor::lightness(&((pQVar4->d)._M_t.
                                super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                                super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                                super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl)->color);
    pQVar4 = QPalette::brush((this->systemPalette)._M_t.
                             super___uniq_ptr_impl<QPalette,_std::default_delete<QPalette>_>._M_t.
                             super__Tuple_impl<0UL,_QPalette_*,_std::default_delete<QPalette>_>.
                             super__Head_base<0UL,_QPalette_*,_false>._M_head_impl,Current,Base);
    iVar2 = QColor::lightness(&((pQVar4->d)._M_t.
                                super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                                super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                                super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl)->color);
    CVar3 = Light;
    if (iVar2 <= iVar1) {
      pQVar4 = QPalette::brush((this->systemPalette)._M_t.
                               super___uniq_ptr_impl<QPalette,_std::default_delete<QPalette>_>._M_t.
                               super__Tuple_impl<0UL,_QPalette_*,_std::default_delete<QPalette>_>.
                               super__Head_base<0UL,_QPalette_*,_false>._M_head_impl,Current,Text);
      iVar1 = QColor::lightness(&((pQVar4->d)._M_t.
                                  super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                                  super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                                  super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl)->color);
      pQVar4 = QPalette::brush((this->systemPalette)._M_t.
                               super___uniq_ptr_impl<QPalette,_std::default_delete<QPalette>_>._M_t.
                               super__Tuple_impl<0UL,_QPalette_*,_std::default_delete<QPalette>_>.
                               super__Head_base<0UL,_QPalette_*,_false>._M_head_impl,Current,Base);
      iVar2 = QColor::lightness(&((pQVar4->d)._M_t.
                                  super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                                  super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                                  super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl)->color);
      CVar3 = (uint)(iVar2 < iVar1) * 2;
    }
  }
  return CVar3;
}

Assistant:

Qt::ColorScheme QKdeThemePrivate::colorSchemeFromPalette() const
{
    if (!systemPalette)
        return Qt::ColorScheme::Unknown;
    if (systemPalette->text().color().lightness() < systemPalette->base().color().lightness())
        return Qt::ColorScheme::Light;
    if (systemPalette->text().color().lightness() > systemPalette->base().color().lightness())
        return Qt::ColorScheme::Dark;
    return Qt::ColorScheme::Unknown;
}